

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3OpenTableAndIndices
              (Parse *pParse,Table *pTab,int op,u8 p5,int iBase,u8 *aToOpen,int *piDataCur,
              int *piIdxCur)

{
  sqlite3 *db;
  Vdbe *p;
  Index *pIdx;
  int iDb;
  int p1;
  Index **ppIVar1;
  long lVar2;
  int iVar3;
  
  if (pTab->eTabType == '\x01') {
    *piIdxCur = -999;
    *piDataCur = -999;
    lVar2 = 0;
  }
  else {
    db = pParse->db;
    iDb = sqlite3SchemaToIndex(db,pTab->pSchema);
    if (iBase < 0) {
      iBase = pParse->nTab;
    }
    p = pParse->pVdbe;
    iVar3 = iBase + 1;
    *piDataCur = iBase;
    if (((pTab->tabFlags & 0x80) == 0) && ((aToOpen == (u8 *)0x0 || (*aToOpen != '\0')))) {
      sqlite3OpenTable(pParse,iBase,iDb,pTab,op);
    }
    else if (db->noSharedCache == '\0') {
      sqlite3TableLock(pParse,iDb,pTab->tnum,op == 0x71,pTab->zName);
    }
    *piIdxCur = iVar3;
    lVar2 = 0;
    ppIVar1 = &pTab->pIndex;
    while (pIdx = *ppIVar1, pIdx != (Index *)0x0) {
      p1 = (int)lVar2 + iVar3;
      if (((*(ushort *)&pIdx->field_0x63 & 3) == 2) && ((pTab->tabFlags & 0x80) != 0)) {
        *piDataCur = p1;
        p5 = 0;
      }
      if ((aToOpen == (u8 *)0x0) || (aToOpen[lVar2 + 1] != '\0')) {
        sqlite3VdbeAddOp3(p,op,p1,pIdx->tnum,iDb);
        sqlite3VdbeSetP4KeyInfo(pParse,pIdx);
        if (0 < (long)p->nOp) {
          p->aOp[(long)p->nOp + -1].p5 = (ushort)p5;
        }
      }
      lVar2 = lVar2 + 1;
      ppIVar1 = &pIdx->pNext;
    }
    iVar3 = iVar3 + (int)lVar2;
    if (pParse->nTab < iVar3) {
      pParse->nTab = iVar3;
    }
  }
  return (int)lVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3OpenTableAndIndices(
  Parse *pParse,   /* Parsing context */
  Table *pTab,     /* Table to be opened */
  int op,          /* OP_OpenRead or OP_OpenWrite */
  u8 p5,           /* P5 value for OP_Open* opcodes (except on WITHOUT ROWID) */
  int iBase,       /* Use this for the table cursor, if there is one */
  u8 *aToOpen,     /* If not NULL: boolean for each table and index */
  int *piDataCur,  /* Write the database source cursor number here */
  int *piIdxCur    /* Write the first index cursor number here */
){
  int i;
  int iDb;
  int iDataCur;
  Index *pIdx;
  Vdbe *v;

  assert( op==OP_OpenRead || op==OP_OpenWrite );
  assert( op==OP_OpenWrite || p5==0 );
  assert( piDataCur!=0 );
  assert( piIdxCur!=0 );
  if( IsVirtual(pTab) ){
    /* This routine is a no-op for virtual tables. Leave the output
    ** variables *piDataCur and *piIdxCur set to illegal cursor numbers
    ** for improved error detection. */
    *piDataCur = *piIdxCur = -999;
    return 0;
  }
  iDb = sqlite3SchemaToIndex(pParse->db, pTab->pSchema);
  v = pParse->pVdbe;
  assert( v!=0 );
  if( iBase<0 ) iBase = pParse->nTab;
  iDataCur = iBase++;
  *piDataCur = iDataCur;
  if( HasRowid(pTab) && (aToOpen==0 || aToOpen[0]) ){
    sqlite3OpenTable(pParse, iDataCur, iDb, pTab, op);
  }else if( pParse->db->noSharedCache==0 ){
    sqlite3TableLock(pParse, iDb, pTab->tnum, op==OP_OpenWrite, pTab->zName);
  }
  *piIdxCur = iBase;
  for(i=0, pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext, i++){
    int iIdxCur = iBase++;
    assert( pIdx->pSchema==pTab->pSchema );
    if( IsPrimaryKeyIndex(pIdx) && !HasRowid(pTab) ){
      *piDataCur = iIdxCur;
      p5 = 0;
    }
    if( aToOpen==0 || aToOpen[i+1] ){
      sqlite3VdbeAddOp3(v, op, iIdxCur, pIdx->tnum, iDb);
      sqlite3VdbeSetP4KeyInfo(pParse, pIdx);
      sqlite3VdbeChangeP5(v, p5);
      VdbeComment((v, "%s", pIdx->zName));
    }
  }
  if( iBase>pParse->nTab ) pParse->nTab = iBase;
  return i;
}